

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

uint TA_MACDEXT_FramePPLB(TA_ParamHolderPriv *params)

{
  uint uVar1;
  undefined8 in_RDI;
  int in_stack_00000008;
  TA_MAType in_stack_0000000c;
  int in_stack_00000010;
  
  uVar1 = TA_MACDEXT_Lookback(in_stack_00000010,in_stack_0000000c,in_stack_00000008,params._4_4_,
                              (int)params,(TA_MAType)((ulong)in_RDI >> 0x20));
  return uVar1;
}

Assistant:

unsigned int TA_MACDEXT_FramePPLB( const TA_ParamHolderPriv *params )
/* Generated */ {
/* Generated */    return TA_MACDEXT_Lookback(params->optIn[0].data.optInInteger, /* optInFastPeriod*/
/* Generated */                         (TA_MAType)params->optIn[1].data.optInInteger, /* optInFastMAType*/
/* Generated */                         params->optIn[2].data.optInInteger, /* optInSlowPeriod*/
/* Generated */                         (TA_MAType)params->optIn[3].data.optInInteger, /* optInSlowMAType*/
/* Generated */                         params->optIn[4].data.optInInteger, /* optInSignalPeriod*/
/* Generated */                         (TA_MAType)params->optIn[5].data.optInInteger /* optInSignalMAType*/ );
/* Generated */ }